

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O0

void __thiscall gl4cts::anon_unknown_0::ImageSizeMachine::~ImageSizeMachine(ImageSizeMachine *this)

{
  ImageSizeMachine *this_local;
  
  ~ImageSizeMachine(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

~ImageSizeMachine()
	{
		glDeleteProgramPipelines(1, &m_pipeline);
		for (int i = 0; i < 3; ++i)
			glDeleteProgram(m_program[i]);
		glDeleteVertexArrays(1, &m_vertex_array);
		glDeleteTextures(1, &m_texture);
	}